

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall
GEO::geofile::translate_data(geofile *this,double *delta_x,double *delta_y,double *delta_z)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_40;
  iterator i;
  iterator end;
  double *delta_z_local;
  double *delta_y_local;
  double *delta_x_local;
  geofile *this_local;
  
  end._M_node._7_1_ = 1;
  make_coherent(this,(bool *)((long)&end._M_node + 7));
  simplify_data(this);
  i = std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
      ::end(&this->points_map);
  local_40._M_node =
       (_Base_ptr)
       std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
       ::begin(&this->points_map);
  while( true ) {
    bVar1 = std::operator!=(&local_40,&i);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator->(&local_40);
    translate_point(this,&ppVar2->second,delta_x,delta_y,delta_z);
    std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator++(&local_40,0);
  }
  return 0;
}

Assistant:

int GEO::geofile::translate_data(   const double &delta_x,
                                    const double &delta_y,
                                    const double &delta_z )
{
    make_coherent(true);
    simplify_data();
    auto end = points_map.end();
    for (auto i = points_map.begin(); i != end; i++)
    {
        translate_point(i->second, delta_x, delta_y, delta_z);
    }
    return EXIT_SUCCESS;
}